

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  Layer *__arg;
  pointer pMVar3;
  int *piVar4;
  long *plVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  pointer pMVar13;
  pointer piVar14;
  pointer piVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  Mat m;
  Mat local_c8;
  allocator_type local_79;
  Mat local_78;
  Net *local_38;
  
  __arg = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_start[layer_index];
  local_38 = this;
  if (__arg->one_blob_only == true) {
    iVar12 = *(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar10 = *(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pMVar13[iVar12].dims == 0) {
      iVar11 = forward_layer(this,(this->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar12].producer,
                             blob_mats,opt);
      if (iVar11 != 0) {
        return iVar11;
      }
      pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    local_c8.data = pMVar13[iVar12].data;
    local_c8.refcount = pMVar13[iVar12].refcount;
    local_c8.elemsize = pMVar13[iVar12].elemsize;
    local_c8.packing = pMVar13[iVar12].packing;
    local_c8.allocator = pMVar13[iVar12].allocator;
    piVar4 = &pMVar13[iVar12].dims;
    local_c8.dims = *piVar4;
    local_c8.w = piVar4[1];
    local_c8.h = piVar4[2];
    local_c8.c = piVar4[3];
    local_c8.cstep = pMVar13[iVar12].cstep;
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + 1;
      UNLOCK();
    }
    if (opt->lightmode == true) {
      pMVar3 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pMVar13 = pMVar3 + iVar12;
      piVar4 = pMVar3[iVar12].refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar13->allocator == (Allocator *)0x0) {
            if (pMVar13->data != (void *)0x0) {
              free(pMVar13->data);
            }
          }
          else {
            (*pMVar13->allocator->_vptr_Allocator[3])();
          }
        }
      }
      *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
      pMVar13->data = (void *)0x0;
      pMVar13->refcount = (int *)0x0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->c = 0;
      pMVar13->cstep = 0;
      if ((__arg->support_inplace == true) && (*local_c8.refcount != 1)) {
        if ((local_c8.data == (void *)0x0) || (local_c8.cstep * (long)local_c8.c == 0)) {
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.packing = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
        }
        else {
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.packing = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          if (local_c8.dims == 3) {
            Mat::create(&local_78,local_c8.w,local_c8.h,local_c8.c,local_c8.elemsize,
                        local_c8.packing,(Allocator *)0x0);
          }
          else if (local_c8.dims == 2) {
            Mat::create(&local_78,local_c8.w,local_c8.h,local_c8.elemsize,local_c8.packing,
                        (Allocator *)0x0);
          }
          else if (local_c8.dims == 1) {
            Mat::create(&local_78,local_c8.w,local_c8.elemsize,local_c8.packing,(Allocator *)0x0);
          }
          if ((long)local_c8.c * local_c8.cstep != 0) {
            memcpy(local_78.data,local_c8.data,(long)local_c8.c * local_c8.cstep * local_c8.elemsize
                  );
          }
        }
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        local_c8.data = local_78.data;
        local_c8.elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        local_c8.packing = local_78.packing;
        local_c8.allocator = local_78.allocator;
        local_c8.dims = local_78.dims;
        local_c8.w = local_78.w;
        local_c8.h = local_78.h;
        local_c8.c = local_78.c;
        local_c8.cstep = local_78.cstep;
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    if ((opt->lightmode == true) && (__arg->support_inplace == true)) {
      iVar12 = (*__arg->_vptr_Layer[9])(__arg,&local_c8,opt);
      if (iVar12 == 0) {
        pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + iVar10;
        bVar18 = true;
        iVar12 = 0;
        if (pMVar13 != &local_c8) {
          if (local_c8.refcount != (int *)0x0) {
            LOCK();
            *local_c8.refcount = *local_c8.refcount + 1;
            UNLOCK();
          }
          piVar4 = pMVar13->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar13->allocator == (Allocator *)0x0) {
                if (pMVar13->data != (void *)0x0) {
                  free(pMVar13->data);
                }
              }
              else {
                (*pMVar13->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
          pMVar13->data = (void *)0x0;
          pMVar13->refcount = (int *)0x0;
          pMVar13->dims = 0;
          pMVar13->w = 0;
          pMVar13->h = 0;
          pMVar13->c = 0;
          pMVar13->cstep = 0;
          pMVar13->data = local_c8.data;
          pMVar13->refcount = local_c8.refcount;
          pMVar13->elemsize = local_c8.elemsize;
          pMVar13->packing = local_c8.packing;
          pMVar13->allocator = local_c8.allocator;
          pMVar13->dims = local_c8.dims;
          pMVar13->w = local_c8.w;
          pMVar13->h = local_c8.h;
          pMVar13->c = local_c8.c;
          pMVar13->cstep = local_c8.cstep;
          iVar12 = 0;
        }
      }
      else {
        bVar18 = false;
      }
    }
    else {
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.packing = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.c = 0;
      local_78.cstep = 0;
      iVar12 = (*__arg->_vptr_Layer[7])(__arg,&local_c8,&local_78,opt);
      bVar18 = iVar12 == 0;
      if ((bVar18) &&
         (pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar10, pMVar13 != &local_78)) {
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar13->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (pMVar13->allocator == (Allocator *)0x0) {
              if (pMVar13->data != (void *)0x0) {
                free(pMVar13->data);
              }
            }
            else {
              (*pMVar13->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
        pMVar13->data = (void *)0x0;
        pMVar13->refcount = (int *)0x0;
        pMVar13->dims = 0;
        pMVar13->w = 0;
        pMVar13->h = 0;
        pMVar13->c = 0;
        pMVar13->cstep = 0;
        pMVar13->data = local_78.data;
        pMVar13->refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        pMVar13->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        pMVar13->packing = local_78.packing;
        pMVar13->allocator = local_78.allocator;
        pMVar13->dims = local_78.dims;
        pMVar13->w = local_78.w;
        pMVar13->h = local_78.h;
        pMVar13->c = local_78.c;
        pMVar13->cstep = local_78.cstep;
      }
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar18) {
      return iVar12;
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78,
               (long)(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,(allocator_type *)&local_c8);
    piVar14 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar14) {
      lVar16 = 0;
      uVar17 = 0;
      do {
        iVar12 = piVar14[uVar17];
        pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pMVar13[iVar12].dims == 0) {
          iVar10 = forward_layer(local_38,(local_38->blobs).
                                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar12].producer
                                 ,blob_mats,opt);
          if (iVar10 != 0) goto LAB_0011c59b;
          pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        pvVar9 = local_78.data;
        pMVar13 = pMVar13 + iVar12;
        pMVar3 = (pointer)((long)local_78.data + lVar16);
        if (pMVar3 != pMVar13) {
          piVar4 = pMVar13->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = *(int **)((long)local_78.data + lVar16 + 8);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              plVar5 = *(long **)((long)local_78.data + lVar16 + 0x20);
              if (plVar5 == (long *)0x0) {
                if (*(void **)((long)local_78.data + lVar16) != (void *)0x0) {
                  free(*(void **)((long)local_78.data + lVar16));
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
          pMVar3->data = (void *)0x0;
          pMVar3->refcount = (int *)0x0;
          puVar2 = (undefined8 *)((long)pvVar9 + lVar16 + 0x28);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)pvVar9 + lVar16 + 0x38) = 0;
          piVar4 = pMVar13->refcount;
          *(undefined8 *)((long)pvVar9 + lVar16) = pMVar13->data;
          ((undefined8 *)((long)pvVar9 + lVar16))[1] = piVar4;
          *(size_t *)((long)pvVar9 + lVar16 + 0x10) = pMVar13->elemsize;
          *(int *)((long)pvVar9 + lVar16 + 0x18) = pMVar13->packing;
          *(Allocator **)((long)pvVar9 + lVar16 + 0x20) = pMVar13->allocator;
          iVar10 = pMVar13->w;
          iVar11 = pMVar13->h;
          iVar6 = pMVar13->c;
          piVar4 = (int *)((long)pvVar9 + lVar16 + 0x28);
          *piVar4 = pMVar13->dims;
          piVar4[1] = iVar10;
          piVar4[2] = iVar11;
          piVar4[3] = iVar6;
          *(size_t *)((long)pvVar9 + lVar16 + 0x38) = pMVar13->cstep;
        }
        if (opt->lightmode == true) {
          pMVar3 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar13 = pMVar3 + iVar12;
          piVar4 = pMVar3[iVar12].refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar13->allocator == (Allocator *)0x0) {
                if (pMVar13->data != (void *)0x0) {
                  free(pMVar13->data);
                }
              }
              else {
                (*pMVar13->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
          pMVar13->data = (void *)0x0;
          pMVar13->refcount = (int *)0x0;
          pMVar13->dims = 0;
          pMVar13->w = 0;
          pMVar13->h = 0;
          pMVar13->c = 0;
          pMVar13->cstep = 0;
          if ((__arg->support_inplace == true) &&
             (**(int **)((long)local_78.data + lVar16 + 8) != 1)) {
            Mat::clone(&local_c8,(__fn *)((long)local_78.data + lVar16),(void *)0x0,(int)opt,__arg);
            pvVar9 = local_78.data;
            pMVar1 = (Mat *)((long)local_78.data + lVar16);
            if (pMVar1 != &local_c8) {
              if (local_c8.refcount != (int *)0x0) {
                LOCK();
                *local_c8.refcount = *local_c8.refcount + 1;
                UNLOCK();
              }
              piVar4 = *(int **)((long)local_78.data + lVar16 + 8);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar5 = *(long **)((long)local_78.data + lVar16 + 0x20);
                  if (plVar5 == (long *)0x0) {
                    if (*(void **)((long)local_78.data + lVar16) != (void *)0x0) {
                      free(*(void **)((long)local_78.data + lVar16));
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar9 + lVar16 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar9 + lVar16 + 0x38) = 0;
              *(void **)((long)pvVar9 + lVar16) = local_c8.data;
              *(int **)((long)pvVar9 + lVar16 + 8) = local_c8.refcount;
              *(size_t *)((long)pvVar9 + lVar16 + 0x10) = local_c8.elemsize;
              *(int *)((long)pvVar9 + lVar16 + 0x18) = local_c8.packing;
              *(Allocator **)((long)pvVar9 + lVar16 + 0x20) = local_c8.allocator;
              piVar4 = (int *)((long)pvVar9 + lVar16 + 0x28);
              *piVar4 = local_c8.dims;
              piVar4[1] = local_c8.w;
              piVar4[2] = local_c8.h;
              piVar4[3] = local_c8.c;
              *(size_t *)((long)pvVar9 + lVar16 + 0x38) = local_c8.cstep;
            }
            if (local_c8.refcount != (int *)0x0) {
              LOCK();
              *local_c8.refcount = *local_c8.refcount + -1;
              UNLOCK();
              if (*local_c8.refcount == 0) {
                if (local_c8.allocator == (Allocator *)0x0) {
                  if (local_c8.data != (void *)0x0) {
                    free(local_c8.data);
                  }
                }
                else {
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        uVar17 = uVar17 + 1;
        piVar14 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 0x40;
      } while (uVar17 < (ulong)((long)(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)piVar14 >>
                               2));
    }
    if ((opt->lightmode == true) && (__arg->support_inplace == true)) {
      iVar10 = (*__arg->_vptr_Layer[8])(__arg,&local_78,opt);
      if (iVar10 != 0) {
LAB_0011c59b:
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78);
        return iVar10;
      }
      piVar14 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar15 != piVar14) {
        lVar16 = 0;
        uVar17 = 0;
        do {
          pvVar9 = local_78.data;
          pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar14[uVar17];
          if ((pointer)((long)local_78.data + lVar16) != pMVar13) {
            piVar4 = *(int **)((long)local_78.data + lVar16 + 8);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = pMVar13->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pMVar13->allocator == (Allocator *)0x0) {
                  if (pMVar13->data != (void *)0x0) {
                    free(pMVar13->data);
                  }
                }
                else {
                  (*pMVar13->allocator->_vptr_Allocator[3])();
                }
              }
            }
            *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
            pMVar13->data = (void *)0x0;
            pMVar13->refcount = (int *)0x0;
            pMVar13->dims = 0;
            pMVar13->w = 0;
            pMVar13->h = 0;
            pMVar13->c = 0;
            pMVar13->cstep = 0;
            piVar4 = (int *)((undefined8 *)((long)pvVar9 + lVar16))[1];
            pMVar13->data = *(void **)((long)pvVar9 + lVar16);
            pMVar13->refcount = piVar4;
            pMVar13->elemsize = *(size_t *)((long)pvVar9 + lVar16 + 0x10);
            pMVar13->packing = *(int *)((long)pvVar9 + lVar16 + 0x18);
            pMVar13->allocator = *(Allocator **)((long)pvVar9 + lVar16 + 0x20);
            puVar2 = (undefined8 *)((long)pvVar9 + lVar16 + 0x28);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            pMVar13->dims = (int)uVar7;
            pMVar13->w = (int)((ulong)uVar7 >> 0x20);
            pMVar13->h = (int)uVar8;
            pMVar13->c = (int)((ulong)uVar8 >> 0x20);
            pMVar13->cstep = *(size_t *)((long)pvVar9 + lVar16 + 0x38);
            piVar14 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0x40;
        } while (uVar17 < (ulong)((long)piVar15 - (long)piVar14 >> 2));
      }
    }
    else {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8,
                 (long)(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data >> 2,&local_79);
      iVar10 = (*__arg->_vptr_Layer[6])(__arg,&local_78,&local_c8,opt);
      if (iVar10 != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
        goto LAB_0011c59b;
      }
      piVar14 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar15 != piVar14) {
        lVar16 = 0;
        uVar17 = 0;
        do {
          pvVar9 = local_c8.data;
          pMVar13 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar14[uVar17];
          if ((pointer)((long)local_c8.data + lVar16) != pMVar13) {
            piVar4 = *(int **)((long)local_c8.data + lVar16 + 8);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = pMVar13->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pMVar13->allocator == (Allocator *)0x0) {
                  if (pMVar13->data != (void *)0x0) {
                    free(pMVar13->data);
                  }
                }
                else {
                  (*pMVar13->allocator->_vptr_Allocator[3])();
                }
              }
            }
            *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
            pMVar13->data = (void *)0x0;
            pMVar13->refcount = (int *)0x0;
            pMVar13->dims = 0;
            pMVar13->w = 0;
            pMVar13->h = 0;
            pMVar13->c = 0;
            pMVar13->cstep = 0;
            piVar4 = (int *)((undefined8 *)((long)pvVar9 + lVar16))[1];
            pMVar13->data = *(void **)((long)pvVar9 + lVar16);
            pMVar13->refcount = piVar4;
            pMVar13->elemsize = *(size_t *)((long)pvVar9 + lVar16 + 0x10);
            pMVar13->packing = *(int *)((long)pvVar9 + lVar16 + 0x18);
            pMVar13->allocator = *(Allocator **)((long)pvVar9 + lVar16 + 0x20);
            puVar2 = (undefined8 *)((long)pvVar9 + lVar16 + 0x28);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            pMVar13->dims = (int)uVar7;
            pMVar13->w = (int)((ulong)uVar7 >> 0x20);
            pMVar13->h = (int)uVar8;
            pMVar13->c = (int)((ulong)uVar8 >> 0x20);
            pMVar13->cstep = *(size_t *)((long)pvVar9 + lVar16 + 0x38);
            piVar14 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0x40;
        } while (uVar17 < (ulong)((long)piVar15 - (long)piVar14 >> 2));
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78);
  }
  return 0;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}